

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiowrt.c
# Opt level: O0

void fiowrtsym(void *ctx0,toksdef *t)

{
  size_t sVar1;
  undefined1 *in_RSI;
  long in_RDI;
  osfildef *fp;
  errcxdef *ec;
  uchar buf [89];
  fiowcxdef *ctx;
  FILE *__s;
  errcxdef *ctx_00;
  byte local_78;
  undefined1 local_77;
  undefined1 auStack_76 [2];
  undefined1 auStack_74 [100];
  undefined1 *local_10;
  
  ctx_00 = *(errcxdef **)(in_RDI + 8);
  __s = *(FILE **)(in_RDI + 0x10);
  local_78 = in_RSI[6];
  local_77 = *in_RSI;
  local_10 = in_RSI;
  oswp2(auStack_76,(uint)*(ushort *)(in_RSI + 2));
  memcpy(auStack_74,local_10 + 7,(ulong)local_78);
  sVar1 = fwrite(&local_78,(long)(int)((byte)local_10[6] + 4),1,__s);
  if (sVar1 != 1) {
    errsigf(ctx_00,(char *)__s,0);
  }
  return;
}

Assistant:

static void fiowrtsym(void *ctx0, toksdef *t)
{
    fiowcxdef  *ctx = (fiowcxdef *)ctx0;
    uchar       buf[TOKNAMMAX + 50];
    errcxdef   *ec = ctx->fiowcxerr;
    osfildef   *fp = ctx->fiowcxfp;

    buf[0] = t->tokslen;
    buf[1] = t->tokstyp;
    oswp2(buf + 2, t->toksval);
    memcpy(buf + 4, t->toksnam, (size_t)buf[0]);
    if (osfwb(fp, buf, 4 + t->tokslen)) errsig(ec, ERR_WRTGAM);
}